

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86.c
# Opt level: O2

lzma_ret x86_coder_init(lzma_next_coder_conflict9 *next,lzma_allocator *allocator,
                       lzma_filter_info *filters,_Bool is_encoder)

{
  lzma_simple *plVar1;
  lzma_ret lVar2;
  
  lVar2 = lzma_simple_coder_init(next,allocator,filters,x86_code,8,5,1,is_encoder);
  if (lVar2 == LZMA_OK) {
    plVar1 = next->coder->simple;
    plVar1->prev_mask = 0;
    plVar1->prev_pos = 0xfffffffb;
  }
  return lVar2;
}

Assistant:

static lzma_ret
x86_coder_init(lzma_next_coder *next, lzma_allocator *allocator,
		const lzma_filter_info *filters, bool is_encoder)
{
	const lzma_ret ret = lzma_simple_coder_init(next, allocator, filters,
			&x86_code, sizeof(lzma_simple), 5, 1, is_encoder);

	if (ret == LZMA_OK) {
		next->coder->simple->prev_mask = 0;
		next->coder->simple->prev_pos = (uint32_t)(-5);
	}

	return ret;
}